

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_fill_mv_costs(nmv_context *nmvc,int integer_mv,int usehp,MvCosts *mv_costs)

{
  int **in_RCX;
  uint in_EDX;
  int in_ESI;
  MvSubpelPrecision in_stack_ffffffffffffffdf;
  nmv_context *in_stack_ffffffffffffffe0;
  nmv_context *ctx;
  
  if (in_RCX != (int **)0x0) {
    in_RCX[0x10000] = (int *)((long)in_RCX + 0x1000c);
    in_RCX[0x10001] = (int *)(in_RCX + 0x6001);
    in_RCX[0x10002] = (int *)((long)in_RCX + 0x50004);
    in_RCX[0x10003] = (int *)(in_RCX + 0xe000);
    if (in_ESI == 0) {
      if (in_EDX == 0) {
        ctx = (nmv_context *)(in_RCX + 0x10000);
      }
      else {
        ctx = (nmv_context *)(in_RCX + 0x10002);
      }
      in_RCX[0x10004] = (int *)ctx;
      av1_build_nmv_cost_table((int *)(ulong)in_EDX,in_RCX,ctx,in_stack_ffffffffffffffdf);
    }
    else {
      in_RCX[0x10004] = (int *)(in_RCX + 0x10000);
      av1_build_nmv_cost_table
                ((int *)CONCAT44(in_ESI,in_EDX),in_RCX,in_stack_ffffffffffffffe0,
                 in_stack_ffffffffffffffdf);
    }
  }
  return;
}

Assistant:

void av1_fill_mv_costs(const nmv_context *nmvc, int integer_mv, int usehp,
                       MvCosts *mv_costs) {
  // Avoid accessing 'mv_costs' when it is not allocated.
  if (mv_costs == NULL) return;

  mv_costs->nmv_cost[0] = &mv_costs->nmv_cost_alloc[0][MV_MAX];
  mv_costs->nmv_cost[1] = &mv_costs->nmv_cost_alloc[1][MV_MAX];
  mv_costs->nmv_cost_hp[0] = &mv_costs->nmv_cost_hp_alloc[0][MV_MAX];
  mv_costs->nmv_cost_hp[1] = &mv_costs->nmv_cost_hp_alloc[1][MV_MAX];
  if (integer_mv) {
    mv_costs->mv_cost_stack = (int **)&mv_costs->nmv_cost;
    av1_build_nmv_cost_table(mv_costs->nmv_joint_cost, mv_costs->mv_cost_stack,
                             nmvc, MV_SUBPEL_NONE);
  } else {
    mv_costs->mv_cost_stack =
        usehp ? mv_costs->nmv_cost_hp : mv_costs->nmv_cost;
    av1_build_nmv_cost_table(mv_costs->nmv_joint_cost, mv_costs->mv_cost_stack,
                             nmvc, usehp);
  }
}